

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O1

void __thiscall
security::SimpleCipher::Cipher(SimpleCipher *this,uint8_t *data,uint bytes,uint64_t sequence)

{
  uint32_t uVar1;
  uint32_t auVar2 [4];
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined8 in_YMM6_H;
  undefined8 in_register_00001398;
  undefined1 auVar14 [16];
  uint32_t k [4];
  uint32_t a [4];
  
  if (this->ExpandedKey[1] != 0 || this->ExpandedKey[0] != 0) {
    auVar7 = vpbroadcastd_avx512vl();
    auVar7 = vpmuludq_avx2(auVar7,_DAT_0019f8c0);
    auVar10 = vpsrlq_avx2(auVar7,0x13);
    auVar5 = vpmovqd_avx512vl(auVar10 ^ auVar7);
    auVar6 = vpbroadcastd_avx512vl();
    auVar2 = (uint32_t  [4])vpaddd_avx(auVar6,auVar5);
    a[0] = auVar2[0];
    a[1] = auVar2[1];
    a[2] = auVar2[2];
    a[3] = auVar2[3];
    k = *&this->ExpandedKey;
    if (0xf < bytes) {
      auVar5._8_4_ = 0xffffff00;
      auVar5._0_8_ = 0xffffff00ffffff00;
      auVar5._12_4_ = 0xffffff00;
      auVar8 = vpmovsxbd_avx512f(_DAT_0019f8f0);
      do {
        k = (uint32_t  [4])vpaddd_avx((undefined1  [16])k,(undefined1  [16])auVar2);
        auVar6 = vpternlogd_avx512vl(*(undefined1 (*) [16])data,*(undefined1 (*) [16])data,auVar5,
                                     0xd8);
        auVar6 = auVar6 ^ (undefined1  [16])k;
        auVar11 = vpsrld_avx(auVar6,0x18);
        auVar13 = vpsrld_avx(auVar6,0x10);
        auVar14 = vpsrld_avx(auVar6,8);
        auVar7._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar6;
        auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
        auVar10._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar13;
        auVar6._8_8_ = in_register_00001398;
        auVar6._0_8_ = in_YMM6_H;
        auVar12._32_32_ = in_ZMM5._32_32_;
        auVar10._16_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar11;
        auVar12._0_32_ = auVar10;
        auVar9 = vinserti64x4_avx512f(ZEXT3264(auVar7),auVar7,1);
        in_ZMM5 = vinserti64x4_avx512f(auVar12,auVar10,1);
        auVar9 = vpermt2d_avx512f(auVar9,auVar8,in_ZMM5);
        auVar6 = vpmovdb_avx512f(auVar9);
        *(undefined1 (*) [16])data = auVar6;
        data = (uint8_t *)((long)data + 0x10);
        bytes = bytes - 0x10;
      } while (0xf < bytes);
      k[0] = k[0];
      k[1] = k[1];
      k[2] = k[2];
      k[3] = k[3];
    }
    if (bytes < 4) {
      lVar3 = 0;
    }
    else {
      uVar4 = bytes - 4;
      bytes = uVar4 & 3;
      lVar3 = 0;
      do {
        uVar1 = k[lVar3];
        k[lVar3] = uVar1 + a[lVar3];
        *(uint *)*(undefined1 (*) [16])data = *(uint *)*(undefined1 (*) [16])data ^ uVar1 + a[lVar3]
        ;
        data = *(undefined1 (*) [16])data + 4;
        lVar3 = lVar3 + 1;
      } while ((uVar4 >> 2) + 1 != (int)lVar3);
    }
    if (bytes != 0) {
      uVar1 = k[lVar3];
      k[lVar3] = uVar1 + a[lVar3];
      if (bytes == 1) {
        uVar4 = (uint)(byte)(*(undefined1 (*) [16])data)[0];
      }
      else {
        uVar4 = 0;
        if (bytes != 2) {
          uVar4 = (uint)(byte)(*(undefined1 (*) [16])data)[2] << 0x10;
        }
        uVar4 = (byte)(*(undefined1 (*) [16])data)[0] | uVar4 |
                (uint)(byte)(*(undefined1 (*) [16])data)[1] << 8;
      }
      uVar4 = uVar4 ^ uVar1 + a[lVar3];
      if (bytes != 1) {
        if (bytes != 2) {
          (*(undefined1 (*) [16])data)[2] = (char)(uVar4 >> 0x10);
        }
        (*(undefined1 (*) [16])data)[1] = (char)(uVar4 >> 8);
      }
      (*(undefined1 (*) [16])data)[0] = (char)uVar4;
    }
  }
  return;
}

Assistant:

void SimpleCipher::Cipher(uint8_t* data, unsigned bytes, uint64_t sequence)
{
#ifndef SECURITY_ENABLE_ENCRYPTION
    SECURITY_UNUSED(data); SECURITY_UNUSED(bytes); SECURITY_UNUSED(nonce);
#else // SECURITY_ENABLE_ENCRYPTION
    // Skip encryption if the key is zero
    if (ExpandedKey[0] == 0 && ExpandedKey[1] == 0) {
        return;
    }

    /*
        Encryption and decryption are the same:

        (1) Mix session key and nonce into 16 byte datagram key
        (2) XOR 16 bytes of data at a time by the datagram key

        This admits a lot of attacks of course:  Plaintext data that is zeros
        will reveal the XOR key for the rest of that datagram.  Two 16-byte
        blocks can be XOR'd together to get the XOR of two plaintext pieces.
        Each key leak will eventually lead to session key recovery fairly fast.

        It's not secure. But it is very fast, hides the packet contents, and
        will slow down reverse-engineers who always win eventually.
    */

    static const uint32_t p0 = 0x905c4577;
    static const uint32_t p1 = 0xb84c88cb;
    static const uint32_t p2 = 0xde0efbf1;
    static const uint32_t p3 = 0x9f614c3d;
    static const uint32_t p4 = 0xf3f77d13;
    static const uint32_t x0 = 0x80771ab1;
    static const uint32_t x1 = 0x55f2cc88;

    const uint32_t n0 = (uint32_t)sequence + x0;
    const uint32_t n1 = MultiplyAndFold19((uint32_t)(sequence >> 32) + x1, p4);

    // Mix session key and nonce
    const uint32_t a[4] = {
        MultiplyAndFold19(p0, n0) + n1,
        MultiplyAndFold19(p1, n0) + n1,
        MultiplyAndFold19(p2, n0) + n1,
        MultiplyAndFold19(p3, n0) + n1
    };

    uint32_t k[4];
    for (int i = 0; i < 4; ++i) {
        k[i] = ExpandedKey[i];
    }

    // Handle sets of 16 bytes
#ifdef ENABLE_SIMD_ENCRYPTION
    if (bytes >= 16)
    {
        SECURITY_M128 key = _mm_set_epi32(k[3], k[2], k[1], k[0]);
        const SECURITY_M128 add = _mm_set_epi32(a[3], a[2], a[1], a[0]);

        while (bytes >= 16)
        {
            key = _mm_add_epi32(key, add);

            SECURITY_M128* data16 = reinterpret_cast<SECURITY_M128*>(data);
            _mm_storeu_si128(data16, _mm_xor_si128(_mm_loadu_si128(data16), key));

            data += 16, bytes -= 16;
        }

        union {
            SECURITY_M128 v;
            uint32_t a[4];
        } e;
        e.v = key;
        for (int i = 0; i < 4; ++i) {
            k[i] = e.a[i];
        }
    }
#else
    while (bytes >= 16)
    {
        for (int i = 0; i < 4; ++i)
        {
            k[i] += a[i];
            const uint32_t x = ReadU32_LE(data + i * 4) ^ k[i];
            WriteU32_LE(data + i * 4, x);
        }

        data += 16, bytes -= 16;
    }
#endif

    // XOR remaining bytes
    unsigned i = 0;
    while (bytes >= 4)
    {
        k[i & 3] += a[i & 3];

        WriteU32_LE(data, ReadU32_LE(data) ^ k[i & 3]);
        data += 4, bytes -= 4, ++i;
    }

    if (bytes > 0)
    {
        k[i & 3] += a[i & 3];

        uint32_t x = TailReadLE32(data, bytes);
        x ^= k[i & 3];
        TailWriteLE32(x, data, bytes);
    }
#endif // SECURITY_ENABLE_ENCRYPTION
}